

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  HashElement *pHVar1;
  PortInfo *pPVar2;
  int iVar3;
  _List_node_base *p_Var4;
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar5;
  uint16_t port_local;
  uint32_t ip_local;
  PortInfo *portinf;
  
  port_local = port;
  ip_local = ip;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::GotoElement(&this->acceptignoreinfo,&ip_local);
  pHVar1 = (this->acceptignoreinfo).curhashelem;
  if (pHVar1 == (HashElement *)0x0) {
    portinf = (PortInfo *)
              operator_new(0x20,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0xc);
    plVar5 = &portinf->portlist;
    (portinf->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar5;
    (portinf->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)plVar5;
    (portinf->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    _M_node._M_size = 0;
    portinf->all = false;
    if (port_local == 0) {
      portinf->all = true;
    }
    else {
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                (plVar5,&port_local);
    }
    iVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            ::AddElement(&this->acceptignoreinfo,&ip_local,&portinf);
    if (iVar3 < 0) {
      RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>
                (portinf,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
      return iVar3;
    }
  }
  else {
    pPVar2 = pHVar1->element;
    if (port != 0) {
      if (pPVar2->all != false) {
        return 0;
      }
      plVar5 = &pPVar2->portlist;
      p_Var4 = (_List_node_base *)plVar5;
      do {
        p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)plVar5) {
          std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                    (plVar5,&port_local);
          return 0;
        }
      } while (*(uint16_t *)&p_Var4[1]._M_next != port);
      return 0;
    }
    pPVar2->all = true;
    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar2->portlist);
  }
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}

	return 0;
}